

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::App(App *this,string *description_,string *name,App *parent)

{
  Formatter *__p;
  ConfigINI *__p_00;
  _Rb_tree_header *p_Var1;
  App *pAVar2;
  allocator<char> local_c9;
  string *local_c8;
  string *local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this->_vptr_App = (_func_int **)&PTR__App_00142f20;
  local_b8 = &this->name_;
  ::std::__cxx11::string::string((string *)local_b8,(string *)name);
  local_c0 = &this->description_;
  ::std::__cxx11::string::string((string *)local_c0,(string *)description_);
  this->allow_extras_ = false;
  this->allow_config_extras_ = false;
  this->prefix_command_ = false;
  *(undefined8 *)&(this->callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback_).super__Function_base._M_functor + 8) = 0;
  (this->callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback_)._M_invoker = (_Invoker_type)0x0;
  OptionBase<CLI::OptionDefaults>::OptionBase
            (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>);
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->options_).
  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->footer_)._M_dataplus._M_p = (pointer)&(this->footer_).field_2;
  (this->footer_)._M_string_length = 0;
  local_c8 = (string *)&this->footer_;
  (this->footer_).field_2._M_local_buf[0] = '\0';
  this->help_ptr_ = (Option *)0x0;
  this->help_all_ptr_ = (Option *)0x0;
  __p = (Formatter *)operator_new(0x40);
  *(undefined8 *)&(__p->super_FormatterBase).labels_._M_t._M_impl = 0;
  *(undefined8 *)&(__p->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (__p->super_FormatterBase).column_width_ = 0x1e;
  p_Var1 = &(__p->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header;
  (__p->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__p->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__p->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__p->super_FormatterBase).labels_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__p->super_FormatterBase)._vptr_FormatterBase = (_func_int **)&PTR__FormatterBase_00142dc8;
  ::std::__shared_ptr<CLI::FormatterBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<CLI::Formatter,void>
            ((__shared_ptr<CLI::FormatterBase,(__gnu_cxx::_Lock_policy)2> *)&this->formatter_,__p);
  *(undefined8 *)((long)&(this->failure_message_).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->failure_message_).super__Function_base._M_functor =
       FailureMessage::simple_abi_cxx11_;
  (this->failure_message_)._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_CLI::App_*,_const_CLI::Error_&)>
       ::_M_invoke;
  (this->failure_message_).super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_CLI::App_*,_const_CLI::Error_&)>
       ::_M_manager;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->missing_).
  super__Vector_base<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifer,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parsed_subcommands_).super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->subcommands_).
  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->ignore_case_ = false;
  this->fallthrough_ = false;
  this->parent_ = parent;
  this->parsed_ = false;
  this->require_subcommand_min_ = 0;
  this->require_subcommand_max_ = 0;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->group_,"Subcommands",&local_c9);
  (this->config_name_)._M_dataplus._M_p = (pointer)&(this->config_name_).field_2;
  (this->config_name_)._M_string_length = 0;
  (this->config_name_).field_2._M_local_buf[0] = '\0';
  this->config_required_ = false;
  this->config_ptr_ = (Option *)0x0;
  __p_00 = (ConfigINI *)operator_new(0x20);
  (__p_00->super_Config)._vptr_Config = (_func_int **)0x0;
  (__p_00->super_Config).items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->super_Config).items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->super_Config).items.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p_00->super_Config)._vptr_Config = (_func_int **)&PTR_to_config_00142e80;
  ::std::__shared_ptr<CLI::Config,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CLI::ConfigINI,void>
            ((__shared_ptr<CLI::Config,(__gnu_cxx::_Lock_policy)2> *)&this->config_formatter_,__p_00
            );
  pAVar2 = this->parent_;
  if (pAVar2 != (App *)0x0) {
    if (pAVar2->help_ptr_ != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_50,pAVar2->help_ptr_,false,true);
      ::std::__cxx11::string::string
                ((string *)&local_70,(string *)&this->parent_->help_ptr_->description_);
      set_help_flag(this,&local_50,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
      pAVar2 = this->parent_;
    }
    if (pAVar2->help_all_ptr_ != (Option *)0x0) {
      Option::get_name_abi_cxx11_(&local_90,pAVar2->help_all_ptr_,false,true);
      ::std::__cxx11::string::string
                ((string *)&local_b0,(string *)&this->parent_->help_all_ptr_->description_);
      set_help_all_flag(this,&local_90,&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_90);
      pAVar2 = this->parent_;
    }
    OptionBase<CLI::OptionDefaults>::operator=
              (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
               &(pAVar2->option_defaults_).super_OptionBase<CLI::OptionDefaults>);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_CLI::App_*,_const_CLI::Error_&)>
    ::operator=(&this->failure_message_,&this->parent_->failure_message_);
    pAVar2 = this->parent_;
    this->allow_extras_ = pAVar2->allow_extras_;
    this->allow_config_extras_ = pAVar2->allow_config_extras_;
    this->prefix_command_ = pAVar2->prefix_command_;
    this->ignore_case_ = pAVar2->ignore_case_;
    this->fallthrough_ = pAVar2->fallthrough_;
    ::std::__cxx11::string::_M_assign((string *)&this->group_);
    ::std::__cxx11::string::_M_assign(local_c8);
    std::__shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->formatter_).
                super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>,
               &(this->parent_->formatter_).
                super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->config_formatter_).
                super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>,
               &(this->parent_->config_formatter_).
                super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>);
    this->require_subcommand_max_ = this->parent_->require_subcommand_max_;
  }
  return;
}

Assistant:

App(std::string description_, std::string name, App *parent)
        : name_(std::move(name)), description_(std::move(description_)), parent_(parent) {
        // Inherit if not from a nullptr
        if(parent_ != nullptr) {
            if(parent_->help_ptr_ != nullptr)
                set_help_flag(parent_->help_ptr_->get_name(false, true), parent_->help_ptr_->get_description());
            if(parent_->help_all_ptr_ != nullptr)
                set_help_all_flag(parent_->help_all_ptr_->get_name(false, true),
                                  parent_->help_all_ptr_->get_description());

            /// OptionDefaults
            option_defaults_ = parent_->option_defaults_;

            // INHERITABLE
            failure_message_ = parent_->failure_message_;
            allow_extras_ = parent_->allow_extras_;
            allow_config_extras_ = parent_->allow_config_extras_;
            prefix_command_ = parent_->prefix_command_;
            ignore_case_ = parent_->ignore_case_;
            fallthrough_ = parent_->fallthrough_;
            group_ = parent_->group_;
            footer_ = parent_->footer_;
            formatter_ = parent_->formatter_;
            config_formatter_ = parent_->config_formatter_;
            require_subcommand_max_ = parent_->require_subcommand_max_;
        }
    }